

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
NormalMutexTest_TryLock_Test<yamc::checked::timed_mutex>::~NormalMutexTest_TryLock_Test
          (NormalMutexTest_TryLock_Test<yamc::checked::timed_mutex> *this)

{
  NormalMutexTest_TryLock_Test<yamc::checked::timed_mutex> *this_local;
  
  ~NormalMutexTest_TryLock_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(NormalMutexTest, TryLock)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock()) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
        std::this_thread::yield();  // provoke lock contention
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}